

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O2

Error asmjit::_abi_1_10::x86::InstInternal::validate
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  InstOptions IVar1;
  BaseInst *pBVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  InstInfo *pIVar8;
  ulong uVar9;
  ulong uVar10;
  Operand_ *pOVar11;
  OpSignature *ref;
  ulong uVar12;
  InstSignature *pIVar13;
  InstSignature *this;
  OpSignature *op;
  size_t index;
  uint uVar14;
  byte bVar15;
  undefined7 in_register_00000039;
  Operand_ *pOVar16;
  uint uVar17;
  byte bVar18;
  ulong uVar19;
  char cVar20;
  bool localImmOutOfRange;
  Operand_ *local_d0;
  Operand_ *local_c8;
  byte local_b9;
  InstSignature *local_b8;
  ulong local_b0;
  ulong local_a8;
  OpSignature *local_a0;
  InstOptions local_98;
  InstOptions local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  BaseInst *local_80;
  ulong local_78;
  undefined1 *local_70;
  OpSignature oSigTranslated [6];
  
  local_b8 = (InstSignature *)CONCAT44(local_b8._4_4_,validationFlags);
  uVar10 = CONCAT71(in_register_00000039,arch) & 0xffffffff;
  if (1 < (byte)(arch - k32BitMask)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/x86/x86instapi.cpp"
               ,0xdd,"Environment::isFamilyX86(arch)");
  }
  cVar20 = (char)uVar10;
  local_70 = _x64ValidationData;
  if (cVar20 == '\x01') {
    local_70 = _x86ValidationData;
  }
  local_84 = (uint)(byte)((cVar20 == '\x02') * '\x02');
  if (cVar20 == '\x01') {
    local_84 = 1;
  }
  if (0x67e < inst->_id) {
    return 0x1a;
  }
  IVar1 = inst->_options;
  pIVar8 = InstDB::infoById(inst->_id);
  local_a8 = (ulong)(*(uint *)pIVar8 >> 0xe & 0x3ff);
  local_90 = *(uint *)(InstDB::_commonInfoTable + local_a8 * 8);
  if ((IVar1 & (kX86_XRelease|kX86_XAcquire|kX86_Lock)) != kNone) {
    if ((IVar1 >> 0xd & 1) == 0) {
      if ((IVar1 & (kX86_XRelease|kX86_XAcquire)) != kNone) {
        return 0x20;
      }
    }
    else {
      if ((local_90 >> 0x10 & 1) == 0) {
        if (opCount == 0) {
          return 0x21;
        }
        if ((IVar1 & (kX86_XRelease|kX86_XAcquire)) == kNone) {
          return 0x21;
        }
      }
      else if (opCount == 0) {
        return 0x21;
      }
      if (((operands->_signature)._bits & 7) != 2) {
        return 0x21;
      }
      if ((IVar1 & (kX86_XRelease|kX86_XAcquire)) != kNone) {
        if ((IVar1 & (kX86_XRelease|kX86_XAcquire)) == (kX86_XRelease|kX86_XAcquire)) {
          return 0x20;
        }
        if (((IVar1 >> 0x10 & 1) != 0) && ((local_90 & 0x20000) == 0)) {
          return 0x22;
        }
        if (((IVar1 >> 0x11 & 1) != 0) && ((local_90 & 0x40000) == 0)) {
          return 0x23;
        }
      }
    }
  }
  local_98 = IVar1 & (kX86_Repne|kX86_Rep);
  if (local_98 != kNone) {
    if (local_98 == (kX86_Repne|kX86_Rep)) {
      return 0x20;
    }
    if ((local_90 >> 0xe & 1) == 0) {
      return 0x24;
    }
  }
  local_8c = 0xc6;
  if (cVar20 == '\x01') {
    local_8c = 0x66;
  }
  local_88 = 0x70c0;
  if (cVar20 == '\x01') {
    local_88 = 0x7060;
  }
  pOVar16 = (Operand_ *)0x0;
  local_d0 = (Operand_ *)0x0;
  uVar7 = 0;
  uVar5 = 0;
  local_c8 = operands;
  local_94 = IVar1;
  local_80 = inst;
  local_78 = uVar10;
  do {
    uVar19 = (ulong)uVar5;
    uVar10 = opCount;
    if (opCount <= uVar19) goto LAB_0013e455;
    uVar17 = operands[uVar19]._signature._bits;
    if (4 < (uVar17 & 7)) {
      return 3;
    }
    pOVar11 = operands + uVar19;
    uVar10 = 0;
    uVar9 = 0;
    switch(uVar17 & 7) {
    case 0:
      pOVar11 = operands + opCount;
      while( true ) {
        pOVar11 = pOVar11 + -1;
        opCount = opCount - 1;
        uVar10 = uVar19;
        if (opCount <= uVar19) break;
        if ((pOVar11->_signature)._bits != 0) {
          return 0x1a;
        }
      }
LAB_0013e455:
      if ((char)local_78 == '\x01') {
        if (((ulong)pOVar16 & 0x10) != 0) {
          return 0x3a;
        }
      }
      else if (((byte)(0xff < uVar7 | (*(byte *)((long)&local_80->_options + 3) & 0x40) >> 6) == 1)
              && (((ulong)pOVar16 & 2) != 0)) {
        return 0x39;
      }
      uVar7 = *(uint *)(InstDB::_commonInfoTable + local_a8 * 8 + 4) >> 0x16 & 0x1f;
      if (uVar7 == 0) {
LAB_0013e612:
        pBVar2 = local_80;
        uVar7 = local_90;
        IVar1 = local_98;
        if ((local_94 & (kX86_ZMask|kX86_SAE|kX86_ER)) != kNone) {
          if ((InstDB::_commonInfoTable[local_a8 * 8 + 2] & 0x80) == 0) {
            return 0x1a;
          }
          if (((local_94 >> 0x17 & 1) != 0) &&
             ((InstDB::_commonInfoTable[local_a8 * 8 + 4] & 2) == 0)) {
            return 0x28;
          }
          if ((local_94 & (kX86_SAE|kX86_ER)) != kNone) {
            if (local_d0 != (Operand_ *)0x0) {
              return 0x2a;
            }
            uVar5 = *(uint *)(InstDB::_commonInfoTable + local_a8 * 8 + 4);
            if ((local_94 >> 0x12 & 1) == 0) {
              uVar17 = uVar5 & 8;
            }
            else {
              uVar17 = uVar5 & 4;
            }
            if (uVar17 == 0) {
              return 0x2a;
            }
            if ((uVar5 & 0x70) != 0) {
              if (uVar10 < 2) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/x86/x86instapi.cpp"
                           ,0x2a0,"opCount >= 2");
              }
              bVar3 = x86IsZmmOrM512(operands);
              if ((!bVar3) && (bVar3 = x86IsZmmOrM512(operands + 1), !bVar3)) {
                return 0x2a;
              }
            }
          }
        }
        uVar5 = (pBVar2->_extraReg)._signature._bits;
        if (uVar5 == 0) {
          return 0;
        }
        if (IVar1 == kNone) {
          if ((uVar5 & 0xf8) != 0x88) {
            return 0x26;
          }
          if ((*(uint *)(InstDB::_commonInfoTable + local_a8 * 8) & 0x800000) != 0) {
            if (((pBVar2->_extraReg)._id != 0) &&
               ((InstDB::_commonInfoTable[local_a8 * 8 + 4] & 1) != 0)) {
              return 0;
            }
            return 0x27;
          }
          return 0x26;
        }
        if ((((-1 < (short)uVar7) && (uVar7 = (pBVar2->_extraReg)._id, 0xfe < uVar7 || uVar7 == 1))
            && (local_d0 != (Operand_ *)0x0)) &&
           (((uVar5 ^ (local_d0->_signature)._bits) & 0xf8) == 0)) {
          return 0;
        }
        return 0x26;
      }
      this = (InstSignature *)
             (InstDB::_instSignatureTable +
             (*(uint *)(InstDB::_commonInfoTable + local_a8 * 8 + 4) >> 8 & 0x3ff8));
      pIVar13 = this + uVar7;
      bVar15 = 0;
      local_b8 = pIVar13;
      local_b0 = uVar10;
      do {
        bVar4 = *(byte *)this;
        if (((byte)local_84 & bVar4 >> 3) != 0) {
          uVar7 = bVar4 & 7;
          localImmOutOfRange = false;
          if (uVar10 == uVar7) {
            op = oSigTranslated;
            for (uVar19 = 0; pIVar13 = local_b8, operands = local_c8, (uint)uVar19 < (uint)uVar10;
                uVar19 = uVar19 + 1) {
              ref = InstDB::InstSignature::opSignature(this,uVar19);
              bVar3 = x86CheckOSig(op,ref,&localImmOutOfRange);
              pIVar13 = local_b8;
              operands = local_c8;
              if (!bVar3) break;
              op = op + 1;
            }
          }
          else {
            uVar19 = 0;
            if (uVar10 == uVar7 - (bVar4 >> 5)) {
              uVar19 = 0;
              for (index = 0;
                  (pIVar13 = local_b8, operands = local_c8, uVar10 = local_b0, uVar19 < local_b0 &&
                  ((uint)index < uVar7)); index = (size_t)((int)index + 1)) {
                local_a0 = oSigTranslated + uVar19;
                while( true ) {
                  bVar4 = InstDB::InstSignature::opSignatureIndex(this,index);
                  if ((InstDB::_opSignatureTable[(ulong)bVar4 * 8 + 6] & 0x80) == 0) break;
                  index = index + 1;
                  pIVar13 = local_b8;
                  operands = local_c8;
                  uVar10 = local_b0;
                  if (uVar7 <= index) goto LAB_0013e5cd;
                }
                bVar3 = x86CheckOSig(local_a0,(OpSignature *)
                                              (InstDB::_opSignatureTable + (ulong)bVar4 * 8),
                                     &localImmOutOfRange);
                pIVar13 = local_b8;
                operands = local_c8;
                uVar10 = local_b0;
                if (!bVar3) break;
                uVar19 = (ulong)((int)uVar19 + 1);
              }
            }
          }
LAB_0013e5cd:
          bVar3 = uVar10 == (uVar19 & 0xffffffff);
          if (bVar3) {
            bVar15 = localImmOutOfRange;
          }
          if ((localImmOutOfRange & 1U) == 0 && bVar3) {
            if (this != pIVar13) goto LAB_0013e612;
            goto LAB_0013e5f9;
          }
        }
        this = this + 1;
        if (this == pIVar13) {
LAB_0013e5f9:
          if ((bVar15 & 1) == 0) {
            return 0x1a;
          }
          return 0x32;
        }
      } while( true );
    case 1:
      uVar17 = uVar17 >> 3 & 0x1f;
      if ((0xfe018f07U >> uVar17 & 1) != 0) {
        return 0x1b;
      }
      uVar12 = *(ulong *)(_x86OpFlagFromRegType + (ulong)uVar17 * 8);
      uVar14 = pOVar11->_baseId;
      if (uVar14 < 0x100) {
        if (0x1f < uVar14) {
          return 0x1d;
        }
        uVar6 = 1 << ((byte)uVar14 & 0x1f);
        uVar10 = (ulong)uVar6;
        if ((*(uint *)(local_70 + (ulong)uVar17 * 4) >> (uVar14 & 0x1f) & 1) == 0) {
          return 0x1d;
        }
        uVar7 = uVar7 | uVar6;
      }
      else {
        uVar10 = 0xffffffffffffffff;
        if (((ulong)local_b8 & 1) == 0) {
          return 0x3e;
        }
      }
      break;
    case 2:
      if ((~uVar17 & 0x1c0000) == 0) {
        return 0x31;
      }
      uVar14 = uVar17 >> 0x18;
      if ((uVar17 & 0xe00000) != 0) {
        uVar6 = *(uint *)(InstDB::_commonInfoTable + local_a8 * 8 + 4);
        if (uVar17 < 0x1000000) {
          uVar14 = 8;
          if ((uVar6 & 0x40) == 0) {
            uVar14 = ((uVar6 & 0x20) >> 4) + 2;
          }
        }
        else if (((uVar14 != 4) && ((uVar6 & 0x20) != 0)) ||
                ((uVar14 != 8 && ((uVar6 & 0x40) != 0)))) {
          return 0x29;
        }
        uVar14 = uVar14 << ((byte)(uVar17 >> 0x15) & 7);
      }
      bVar4 = (byte)uVar17;
      bVar15 = bVar4 >> 3;
      bVar18 = (byte)(uVar17 >> 8) & 0x1f;
      if (bVar4 < 8) {
        local_b0 = CONCAT44(local_b0._4_4_,uVar7);
        local_a0 = (OpSignature *)CONCAT44(local_a0._4_4_,uVar14);
        local_d0 = pOVar16;
        local_b9 = bVar15;
        uVar10 = BaseMem::offset((BaseMem *)pOVar11);
        pOVar16 = local_d0;
        uVar7 = (uint)local_b0;
        bVar15 = local_b9;
        uVar14 = (uint)local_a0;
        if ((long)(int)uVar10 == uVar10) {
LAB_0013e19c:
          local_d0 = pOVar16;
          if ((uVar17 & 0x1f00) != 0) {
LAB_0013e213:
            if ((local_88 >> (uVar17 >> 8 & 0x1f) & 1) == 0) {
              return 0x2b;
            }
            bVar18 = bVar18 - 0xc;
            if (bVar18 < 3) {
              uVar12 = *(ulong *)(&DAT_0015aff0 + (ulong)bVar18 * 8);
LAB_0013e278:
              if ((bVar15 == 2) && ((uVar12 & 0xfc0000000) != 0)) {
                return 0x2b;
              }
            }
            else {
              uVar12 = 0x8000000000000;
              if (7 < bVar4) goto LAB_0013e278;
              uVar12 = 0;
            }
            uVar17 = pOVar11->_data[0];
            if (uVar17 < 0x100) {
              if (0x1f < uVar17) {
                return 0x1d;
              }
              uVar7 = uVar7 | 1 << (uVar17 & 0x1f);
              uVar10 = 0;
            }
            else {
              uVar10 = 0;
              if (((ulong)local_b8 & 1) == 0) {
                return 0x3e;
              }
            }
            goto LAB_0013e2fd;
          }
        }
        else {
          if ((char)local_78 == '\x01') {
            if (uVar10 >> 0x20 != 0) {
              return 0x2e;
            }
            goto LAB_0013e19c;
          }
          if ((uVar17 & 0x1f00) != 0) {
            if (uVar10 >> 0x20 != 0) {
              return 0x2e;
            }
            if (bVar18 != 6) {
              return 0x2f;
            }
            goto LAB_0013e213;
          }
        }
        uVar12 = 0;
        uVar10 = 0;
        pOVar16 = local_d0;
      }
      else {
        if (bVar4 < 0x10) goto LAB_0013e19c;
        uVar6 = pOVar11->_baseId;
        if (((uVar17 >> 0xd & 1) == 0) && ((local_8c >> bVar15 & 1) == 0)) {
          return 0x2b;
        }
        if (uVar6 < 0x100) {
          if (0x1f < uVar6) {
            return 0x1d;
          }
          uVar10 = (ulong)(uint)(1 << ((byte)uVar6 & 0x1f));
          uVar7 = uVar7 | 1 << (uVar6 & 0x1f);
        }
        else {
          uVar10 = 0xffffffffffffffff;
          if (((ulong)local_b8 & 1) == 0) {
            return 0x3e;
          }
        }
        if ((uVar17 & 0x1f00) != 0) goto LAB_0013e213;
        uVar12 = (ulong)(pOVar11->_data[1] == 0) << 0x30;
      }
LAB_0013e2fd:
      operands = local_c8;
      local_d0 = pOVar11;
      switch(uVar14) {
      case 0:
        uVar12 = uVar12 | 0x40000;
        break;
      case 1:
        uVar12 = uVar12 | 0x80000;
        break;
      case 2:
        uVar12 = uVar12 | 0x100000;
        break;
      case 3:
      case 5:
      case 7:
      case 9:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
        return 0x33;
      case 4:
        uVar12 = uVar12 | 0x200000;
        break;
      case 6:
        uVar12 = uVar12 | 0x400000;
        break;
      case 8:
        uVar12 = uVar12 | 0x800000;
        break;
      case 10:
        uVar12 = uVar12 | 0x1000000;
        break;
      case 0x10:
        uVar12 = uVar12 | 0x2000000;
        break;
      default:
        if (uVar14 == 0x20) {
          uVar12 = uVar12 | 0x4000000;
        }
        else {
          if (uVar14 != 0x40) {
            return 0x33;
          }
          uVar12 = uVar12 | 0x8000000;
        }
      }
      break;
    case 3:
      uVar12 = *(ulong *)pOVar11->_data;
      if ((long)uVar12 < 0) {
        uVar12 = -uVar12;
        if (uVar12 < 9) {
          uVar12 = 0x155000000000;
        }
        else if (uVar12 < 0x81) {
          uVar12 = 0x154000000000;
        }
        else if (uVar12 < 0x8001) {
          uVar12 = 0x150000000000;
          uVar10 = uVar9;
        }
        else {
          uVar12 = ((ulong)(uVar12 < 0x80000001) | 4) << 0x2a;
          uVar10 = uVar9;
        }
      }
      else if (uVar12 < 8) {
        uVar12 = 0x3ff000000000;
      }
      else if (uVar12 < 0x10) {
        uVar12 = 0x3fe000000000;
      }
      else if (uVar12 < 0x80) {
        uVar12 = 0x3fc000000000;
      }
      else if (uVar12 < 0x100) {
        uVar12 = 0x3f8000000000;
      }
      else if (uVar12 < 0x8000) {
        uVar12 = 0x3f0000000000;
      }
      else if (uVar12 < 0x10000) {
        uVar12 = 0x3e0000000000;
        uVar10 = uVar9;
      }
      else if (uVar12 < 0x80000000) {
        uVar12 = 0x3c0000000000;
        uVar10 = uVar9;
      }
      else {
        uVar12 = ((ulong)(uVar12 >> 0x20 == 0) | 6) << 0x2b;
        uVar10 = uVar9;
      }
      break;
    case 4:
      uVar12 = 0xc00000000000;
    }
    oSigTranslated[uVar19] = (OpSignature)(uVar10 << 0x38 | uVar12 & 0xffffffffffffff);
    pOVar16 = (Operand_ *)((ulong)pOVar16 | uVar12);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error InstInternal::validate(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
  // Only called when `arch` matches X86 family.
  ASMJIT_ASSERT(Environment::isFamilyX86(arch));

  const X86ValidationData* vd;
  if (arch == Arch::kX86)
    vd = &_x86ValidationData;
  else
    vd = &_x64ValidationData;

  uint32_t i;
  InstDB::Mode mode = InstDB::modeFromArch(arch);

  // Get the instruction data.
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::CommonInfo& commonInfo = instInfo.commonInfo();

  InstDB::InstFlags iFlags = instInfo.flags();

  constexpr InstOptions kRepAny = InstOptions::kX86_Rep | InstOptions::kX86_Repne;
  constexpr InstOptions kXAcqXRel = InstOptions::kX86_XAcquire | InstOptions::kX86_XRelease;
  constexpr InstOptions kAvx512Options = InstOptions::kX86_ZMask | InstOptions::kX86_ER | InstOptions::kX86_SAE;

  // Validate LOCK|XACQUIRE|XRELEASE Prefixes
  // ----------------------------------------

  if (Support::test(options, InstOptions::kX86_Lock | kXAcqXRel)) {
    if (Support::test(options, InstOptions::kX86_Lock)) {
      if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kLock) && !Support::test(options, kXAcqXRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (Support::test(options, kXAcqXRel)) {
      if (ASMJIT_UNLIKELY(!Support::test(options, InstOptions::kX86_Lock) || (options & kXAcqXRel) == kXAcqXRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XAcquire) && !Support::test(iFlags, InstDB::InstFlags::kXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XRelease) && !Support::test(iFlags, InstDB::InstFlags::kXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNE Prefixes
  // -------------------------------

  if (Support::test(options, kRepAny)) {
    if (ASMJIT_UNLIKELY((options & kRepAny) == kRepAny))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate Each Operand to the Corresponding OpSignature
  // -------------------------------------------------------

  InstDB::OpSignature oSigTranslated[Globals::kMaxOpCount];
  InstDB::OpFlags combinedOpFlags = InstDB::OpFlags::kNone;
  uint32_t combinedRegMask = 0;
  const Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.opType() == OperandType::kNone)
      break;

    InstDB::OpFlags opFlags = InstDB::OpFlags::kNone;
    RegMask regMask = 0;

    switch (op.opType()) {
      case OperandType::kReg: {
        RegType regType = op.as<BaseReg>().type();
        opFlags = _x86OpFlagFromRegType[size_t(regType)];

        if (ASMJIT_UNLIKELY(opFlags == InstDB::OpFlags::kNone))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kVirtIdMin it means that the register is virtual and its
        // index will be assigned later by the register allocator. We must pass unless asked to disallow virtual
        // registers.
        uint32_t regId = op.id();
        if (regId < Operand::kVirtIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          if (ASMJIT_UNLIKELY(Support::bitTest(vd->allowedRegMask[size_t(regType)], regId) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Support::bitMask(regId);
          combinedRegMask |= regMask;
        }
        else {
          if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
            return DebugUtils::errored(kErrorIllegalVirtReg);
          regMask = 0xFFFFFFFFu;
        }
        break;
      }

      // TODO: Validate base and index and combine these with `combinedRegMask`.
      case OperandType::kMem: {
        const Mem& m = op.as<Mem>();
        memOp = &m;

        uint32_t memSize = m.size();
        RegType baseType = m.baseType();
        RegType indexType = m.indexType();

        if (m.segmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        // Validate AVX-512 broadcast {1tox}.
        if (m.hasBroadcast()) {
          if (memSize != 0) {
            // If the size is specified it has to match the broadcast size.
            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B32() && memSize != 4))
              return DebugUtils::errored(kErrorInvalidBroadcast);

            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B64() && memSize != 8))
              return DebugUtils::errored(kErrorInvalidBroadcast);
          }
          else {
            // If there is no size we implicitly calculate it so we can validate N in {1toN} properly.
            memSize = commonInfo.hasAvx512B64() ? 8 :
                      commonInfo.hasAvx512B32() ? 4 : 2;
          }

          memSize <<= uint32_t(m.getBroadcast());
        }

        if (baseType != RegType::kNone && baseType > RegType::kLabelTag) {
          uint32_t baseId = m.baseId();

          if (m.isRegHome()) {
            // Home address of a virtual register. In such case we don't want to validate the type of the
            // base register as it will always be patched to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemBaseRegs, baseType)))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit memory operand. Basically
          // only usable for string instructions and other instructions where memory operand is implicit and
          // has 'seg:[reg]' form.
          if (baseId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(baseId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            // Physical base id.
            regMask = Support::bitMask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - fill the whole mask for implicit mem validation. The register is not assigned
            // yet, so we cannot predict the phys id.
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
            regMask = 0xFFFFFFFFu;
          }

          if (indexType == RegType::kNone && !m.offsetLo32())
            opFlags |= InstDB::OpFlags::kFlagMemBase;
        }
        else if (baseType == RegType::kLabelTag) {
          // [Label] - there is no need to validate the base as it's label.
        }
        else {
          // Base is a 64-bit address.
          int64_t offset = m.offset();
          if (!Support::isInt32(offset)) {
            if (mode == InstDB::Mode::kX86) {
              // 32-bit mode: Make sure that the address is either `int32_t` or `uint32_t`.
              if (!Support::isUInt32(offset))
                return DebugUtils::errored(kErrorInvalidAddress64Bit);
            }
            else {
              // 64-bit mode: Zero extension is allowed if the address has 32-bit index register or the address
              // has no index register (it's still encodable).
              if (indexType != RegType::kNone) {
                if (!Support::isUInt32(offset))
                  return DebugUtils::errored(kErrorInvalidAddress64Bit);

                if (indexType != RegType::kX86_Gpd)
                  return DebugUtils::errored(kErrorInvalidAddress64BitZeroExtension);
              }
              else {
                // We don't validate absolute 64-bit addresses without an index register as this also depends
                // on the target's base address. We don't have the information to do it at this moment.
              }
            }
          }
        }

        if (indexType != RegType::kNone) {
          if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemIndexRegs, indexType)))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == RegType::kX86_Xmm) {
            opFlags |= InstDB::OpFlags::kVm32x | InstDB::OpFlags::kVm64x;
          }
          else if (indexType == RegType::kX86_Ymm) {
            opFlags |= InstDB::OpFlags::kVm32y | InstDB::OpFlags::kVm64y;
          }
          else if (indexType == RegType::kX86_Zmm) {
            opFlags |= InstDB::OpFlags::kVm32z | InstDB::OpFlags::kVm64z;
          }
          else {
            if (baseType != RegType::kNone)
              opFlags |= InstDB::OpFlags::kFlagMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == RegType::kX86_Rip && Support::test(opFlags, InstDB::OpFlags::kVmMask))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.indexId();
          if (indexId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(indexId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            combinedRegMask |= Support::bitMask(indexId);
          }
          else {
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
          }

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }

        switch (memSize) {
          case  0: opFlags |= InstDB::OpFlags::kMemUnspecified; break;
          case  1: opFlags |= InstDB::OpFlags::kMem8; break;
          case  2: opFlags |= InstDB::OpFlags::kMem16; break;
          case  4: opFlags |= InstDB::OpFlags::kMem32; break;
          case  6: opFlags |= InstDB::OpFlags::kMem48; break;
          case  8: opFlags |= InstDB::OpFlags::kMem64; break;
          case 10: opFlags |= InstDB::OpFlags::kMem80; break;
          case 16: opFlags |= InstDB::OpFlags::kMem128; break;
          case 32: opFlags |= InstDB::OpFlags::kMem256; break;
          case 64: opFlags |= InstDB::OpFlags::kMem512; break;

          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case OperandType::kImm: {
        uint64_t immValue = op.as<Imm>().valueAs<uint64_t>();

        if (int64_t(immValue) >= 0) {
          if (immValue <= 0x7u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmI4  | InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0xFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0x7Fu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0xFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0x7FFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0xFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0x7FFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0xFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0x7FFFFFFFFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64;
          else
            opFlags = InstDB::OpFlags::kImmU64;
        }
        else {
          immValue = Support::neg(immValue);
          if (immValue <= 0x8u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8 | InstDB::OpFlags::kImmI4;
          else if (immValue <= 0x80u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8;
          else if (immValue <= 0x8000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16;
          else if (immValue <= 0x80000000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32;
          else
            opFlags = InstDB::OpFlags::kImmI64;
        }
        break;
      }

      case OperandType::kLabel: {
        opFlags |= InstDB::OpFlags::kRel8 | InstDB::OpFlags::kRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    InstDB::OpSignature& oSigDst = oSigTranslated[i];
    oSigDst._flags = uint64_t(opFlags) & 0x00FFFFFFFFFFFFFFu;
    oSigDst._regMask = uint8_t(regMask & 0xFFu);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important as Assembler and Compiler may just pass
  // more operands padded with none (which means that no operand is given at that index). However, validate that there
  // are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!operands[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidInstruction);
  }

  // Validate X86 and X64 specific cases.
  if (mode == InstDB::Mode::kX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY(Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpq)))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    bool hasREX = inst.hasOption(InstOptions::kX86_Rex) || (combinedRegMask & 0xFFFFFF00u) != 0;
    if (ASMJIT_UNLIKELY(hasREX && Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpbHi)))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate Instruction Signature by Comparing Against All `iSig` Rows
  // -------------------------------------------------------------------

  const InstDB::InstSignature* iSig = InstDB::_instSignatureTable + commonInfo._iSignatureIndex;
  const InstDB::InstSignature* iEnd = iSig + commonInfo._iSignatureCount;

  if (iSig != iEnd) {
    const InstDB::OpSignature* opSignatureTable = InstDB::_opSignatureTable;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if (!iSig->supportsMode(mode))
        continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount();
      bool localImmOutOfRange = false;

      if (iSigCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!x86CheckOSig(oSigTranslated[j], iSig->opSignature(j), localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicitOpCount() == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iSigCount; j++, r++) {
          const InstDB::OpSignature* oChk = oSigTranslated + j;
          const InstDB::OpSignature* oRef;
Next:
          oRef = opSignatureTable + iSig->opSignatureIndex(r);
          // Skip implicit operands.
          if (oRef->isImplicit()) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX512 Options
  // -----------------------

  const RegOnly& extraReg = inst.extraReg();

  if (Support::test(options, kAvx512Options)) {
    if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {z}.
      if (Support::test(options, InstOptions::kX86_ZMask)) {
        if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 {sae} and {er}.
      if (Support::test(options, InstOptions::kX86_SAE | InstOptions::kX86_ER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (Support::test(options, InstOptions::kX86_ER)) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
        else {
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }

        // {sae} and {er} are defined for either scalar ops or vector ops that require LL to be 10 (512-bit vector
        // operations). We don't need any more bits in the instruction database to be able to validate this, as
        // each AVX512 instruction that has broadcast is vector instruction (in this case we require zmm registers),
        // otherwise it's a scalar instruction, which is valid.
        if (commonInfo.hasAvx512B()) {
          // Supports broadcast, thus we require LL to be '10', which means there have to be ZMM registers used. We
          // don't calculate LL here, but we know that it would be '10' if there is at least one ZMM register used.

          // There is no {er}/{sae}-enabled instruction with less than two operands.
          ASMJIT_ASSERT(opCount >= 2);
          if (ASMJIT_UNLIKELY(!x86IsZmmOrM512(operands[0]) && !x86IsZmmOrM512(operands[1])))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not an AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNE prefix.
      if (Support::test(options, kAvx512Options) || !Support::test(options, kRepAny))
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate {Extra} Register
  // -------------------------

  if (extraReg.isReg()) {
    if (Support::test(options, kRepAny)) {
      // Validate REP|REPNE {cx|ecx|rcx}.
      if (ASMJIT_UNLIKELY(Support::test(iFlags, InstDB::InstFlags::kRepIgnored)))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (extraReg.isPhysReg()) {
        if (ASMJIT_UNLIKELY(extraReg.id() != Gp::kIdCx))
          return DebugUtils::errored(kErrorInvalidExtraReg);
      }

      // The type of the {...} register must match the type of the base register
      // of memory operand. So if the memory operand uses 32-bit register the
      // count register must also be 32-bit, etc...
      if (ASMJIT_UNLIKELY(!memOp || extraReg.type() != memOp->baseType()))
        return DebugUtils::errored(kErrorInvalidExtraReg);
    }
    else if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {k}.
      if (ASMJIT_UNLIKELY(extraReg.type() != RegType::kX86_KReg))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (ASMJIT_UNLIKELY(extraReg.id() == 0 || !commonInfo.hasAvx512K()))
        return DebugUtils::errored(kErrorInvalidKMaskUse);
    }
    else {
      return DebugUtils::errored(kErrorInvalidExtraReg);
    }
  }

  return kErrorOk;
}